

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void plot_vertical_tiles_common
               (tgestate_t *state,tileindex_t *vistiles,supertileindex_t *maptiles,uint8_t x,
               uint8_t *window)

{
  uint8_t uVar1;
  byte bVar2;
  tileindex_t tVar3;
  byte bVar4;
  char cVar5;
  byte bVar6;
  long lVar7;
  uint uVar8;
  byte *local_50;
  
  uVar8 = x & 3;
  uVar1 = (state->map_position).y;
  bVar2 = *maptiles;
  bVar4 = -uVar1 & 3;
  bVar6 = 4;
  if (bVar4 != 0) {
    bVar6 = bVar4;
  }
  check_map_buf(state);
  lVar7 = 0;
  do {
    tVar3 = supertiles[0].tiles
            [lVar7 * 4 + ((ulong)(byte)(uVar1 * '\x04' & 0xc | (byte)uVar8) | (ulong)bVar2 << 4)];
    *vistiles = tVar3;
    window = plot_tile_then_advance(state,tVar3,maptiles,window);
    vistiles = vistiles + state->columns;
    lVar7 = lVar7 + 1;
  } while (bVar6 != (byte)lVar7);
  local_50 = maptiles + 7;
  cVar5 = '\x03';
  do {
    bVar2 = *local_50;
    lVar7 = 0;
    do {
      tVar3 = supertiles[bVar2].tiles[lVar7 * 4 + (ulong)uVar8];
      *vistiles = tVar3;
      window = plot_tile_then_advance(state,tVar3,local_50,window);
      vistiles = vistiles + state->columns;
      lVar7 = lVar7 + 1;
    } while ((char)lVar7 != '\x04');
    local_50 = local_50 + 7;
    cVar5 = cVar5 + -1;
  } while (cVar5 != '\0');
  bVar2 = *local_50;
  bVar6 = (state->map_position).y;
  lVar7 = 0;
  do {
    tVar3 = supertiles[bVar2].tiles[lVar7 * 4 + (ulong)uVar8];
    *vistiles = tVar3;
    window = plot_tile_then_advance(state,tVar3,local_50,window);
    vistiles = vistiles + state->columns;
    lVar7 = lVar7 + 1;
  } while ((byte)((bVar6 & 3) + 1) != (char)lVar7);
  return;
}

Assistant:

void plot_vertical_tiles_common(tgestate_t             *state,
                                tileindex_t            *vistiles,
                                const supertileindex_t *maptiles,
                                uint8_t                 x,
                                uint8_t                *window)
{
  /* Conv: self_A94D removed. */

  uint8_t            x_offset;  /* was $A94D */
  const tileindex_t *tiles;     /* was HL */  // pointer into supertile
  uint8_t            offset;    /* was A */
  uint8_t            iters;     /* was A */
  uint8_t            iters2;    /* was B' */ // FUTURE: merge with 'iters'

  assert(state != NULL);
  ASSERT_TILE_BUF_PTR_VALID(vistiles);
  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  // assert(x);
  ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

  x_offset = x & 3; // self modify (local)

  /* Initial edge. */

  ASSERT_MAP_POSITION_VALID(state->map_position);
  offset = (state->map_position.y & 3) * 4 + x_offset;

  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[offset];
  ASSERT_SUPERTILE_PTR_VALID(tiles);

  // 0,1,2,3 => 4,3,2,1
  iters = -((offset >> 2) & 3) & 3;
  if (iters == 0)
    iters = 4; // 1..4

  check_map_buf(state);

  do
  {
    tileindex_t t; /* was A */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

    t = *vistiles = *tiles; // A = tile index
    window = plot_tile_then_advance(state, t, maptiles, window);
    tiles += 4; // supertile stride
    vistiles += state->columns;
  }
  while (--iters);

  maptiles += 7; // move to next row

  /* Middle loop. */

  iters2 = 3;
  do
  {
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    assert(*maptiles < supertileindex__LIMIT);
    tiles = &supertiles[*maptiles].tiles[x_offset]; // self modified by $A8F6

    iters = 4;
    do
    {
      tileindex_t t; /* was A */

      ASSERT_TILE_BUF_PTR_VALID(vistiles);
      ASSERT_SUPERTILE_PTR_VALID(tiles);
      ASSERT_MAP_BUF_PTR_VALID(maptiles);
      ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

      t = *vistiles = *tiles; // A = tile index
      window = plot_tile_then_advance(state, t, maptiles, window);
      vistiles += state->columns;
      tiles += 4; // supertile stride
    }
    while (--iters);

    maptiles += 7; // move to next row
  }
  while (--iters2);

  /* Trailing edge. */

  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[x_offset]; // x_offset = read of self modified instruction
  iters = (state->map_position.y & 3) + 1;
  do
  {
    tileindex_t t; /* was A */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

    t = *vistiles = *tiles; // A = tile index
    window = plot_tile_then_advance(state, t, maptiles, window);
    tiles += 4; // supertile stride
    vistiles += state->columns;
  }
  while (--iters);
}